

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O3

fdb_status fdb_iterator_prev(fdb_iterator *iterator)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_char> *paVar2;
  uint64_t *value_buf;
  wal_item_action wVar3;
  ushort uVar4;
  fdb_kvs_id_t fVar5;
  snap_handle *shandle;
  docio_handle *handle;
  size_t *keylen;
  fdb_kvs_id_t fVar6;
  btree_result bVar7;
  fdb_status fVar8;
  uint uVar9;
  int iVar10;
  hbtrie_result hVar11;
  wal_item *pwVar12;
  ulong uVar13;
  int64_t iVar14;
  byte bVar15;
  fdb_kvs_handle *pfVar16;
  ulong uVar17;
  void *pvVar18;
  size_t sVar19;
  uint64_t uVar20;
  bool bVar21;
  bool bVar22;
  uint64_t offset;
  uint64_t hboffset;
  int64_t _offset;
  fdb_kvs_id_t kv_id;
  fdb_doc doc_kv;
  size_t seq_kv_len;
  docio_handle *local_158;
  uint64_t local_150;
  ulong local_148;
  uint64_t local_140;
  docio_object local_138;
  ulong local_f8;
  size_t *local_f0;
  uint64_t local_e8;
  fdb_kvs_id_t local_e0;
  fdb_doc local_d8;
  undefined1 local_88 [8];
  ulong local_80;
  docio_object local_78;
  size_t local_38;
  
  if (iterator == (fdb_iterator *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (iterator->handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  paVar2 = &iterator->handle->handle_busy;
  LOCK();
  bVar21 = (paVar2->super___atomic_base<unsigned_char>)._M_i == '\0';
  if (bVar21) {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\x01';
  }
  UNLOCK();
  uVar17 = 0xffffffd9;
  if (!bVar21) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
    do {
      local_150 = 0xffffffffffffffff;
      local_138.length.keylen = 0;
      local_138.length.metalen = 0;
      local_138.length.bodylen = 0;
      local_138.length.bodylen_ondisk = 0;
      local_138.length.flag = '\0';
      local_138.length.checksum = '\0';
      local_138.length.reserved = 0;
      local_138.timestamp = 0;
      local_138.meta = (void *)0x0;
      local_138.body = (void *)0x0;
      local_138.key = (void *)0x0;
      local_138.field_3.seqnum = 0;
      if (iterator->direction != '\x02') {
        if (iterator->status == '\0') {
          iterator->_offset = 0xffffffffffffffff;
        }
        pwVar12 = iterator->tree_cursor_prev;
        if ((pwVar12 != (wal_item *)0x0) && (iterator->tree_cursor != pwVar12)) {
          pwVar12 = wal_itr_search_smaller(iterator->wal_itr,pwVar12);
          iterator->tree_cursor = pwVar12;
          iterator->status = '\0';
        }
      }
      bVar21 = false;
      do {
        local_148 = iterator->_seqnum;
        pfVar16 = iterator->handle;
        local_158 = pfVar16->dhandle;
        if ((iterator->_offset == 0xffffffffffffffff) ||
           (pwVar12 = iterator->tree_cursor, pwVar12 == (wal_item *)0x0)) {
LAB_0012dad9:
          if (pfVar16->kvs == (kvs_info *)0x0) {
            bVar7 = btree_prev(iterator->seqtree_iterator,&local_148,&local_150);
            btreeblk_end(iterator->handle->bhandle);
            if (bVar7 != BTREE_RESULT_SUCCESS) goto LAB_0012e0f3;
LAB_0012db7a:
            local_148 = local_148 >> 0x38 | (local_148 & 0xff000000000000) >> 0x28 |
                        (local_148 & 0xff0000000000) >> 0x18 | (local_148 & 0xff00000000) >> 8 |
                        (local_148 & 0xff000000) << 8 | (local_148 & 0xff0000) << 0x18 |
                        (local_148 & 0xff00) << 0x28 | local_148 << 0x38;
            iterator->_seqnum = local_148;
            if ((iterator->field_10).start_seqnum <= local_148) {
              local_150 = local_150 >> 0x38 | (local_150 & 0xff000000000000) >> 0x28 |
                          (local_150 & 0xff0000000000) >> 0x18 | (local_150 & 0xff00000000) >> 8 |
                          (local_150 & 0xff000000) << 8 | (local_150 & 0xff0000) << 0x18 |
                          (local_150 & 0xff00) << 0x28 | local_150 << 0x38;
              iterator->status = '\0';
              uVar4 = iterator->opt;
              bVar21 = true;
              goto LAB_0012dbb8;
            }
          }
          else {
            hVar11 = hbtrie_prev(iterator->seqtrie_iterator,local_88,&local_38,&local_150);
            if (hVar11 == HBTRIE_RESULT_SUCCESS) {
              buf2kvid(8,local_88,&local_e0);
              fVar6 = local_e0;
              fVar5 = iterator->handle->kvs->id;
              local_148 = local_80;
              btreeblk_end(iterator->handle->bhandle);
              if (fVar6 == fVar5) goto LAB_0012db7a;
            }
            else {
              btreeblk_end(iterator->handle->bhandle);
            }
LAB_0012e0f3:
            iterator->_offset = 0xffffffffffffffff;
          }
          fVar8 = FDB_RESULT_ITERATOR_FAIL;
          goto LAB_0012e103;
        }
        bVar22 = iterator->status == '\x01';
        do {
          if (bVar22) {
            iterator->tree_cursor_prev = pwVar12;
            pwVar12 = wal_itr_prev(iterator->wal_itr);
            iterator->tree_cursor = pwVar12;
            if (pwVar12 == (wal_item *)0x0) {
              local_148 = iterator->_seqnum;
              pfVar16 = iterator->handle;
              local_158 = pfVar16->dhandle;
              goto LAB_0012dad9;
            }
          }
          iterator->status = '\x01';
          uVar4 = iterator->opt;
        } while (((uVar4 & 1) == 0) &&
                (bVar22 = true,
                pwVar12->action == '\x02' ||
                (pwVar12->action == '\x01' & (byte)((uVar4 & 2) >> 1)) != 0));
        local_150 = pwVar12->offset;
        iterator->_offset = local_150;
        iterator->_seqnum = pwVar12->seqnum;
LAB_0012dbb8:
        if (((uVar4 & 1) != 0) || (!bVar21)) goto LAB_0012e0d1;
        local_138.key = (void *)0x0;
        local_138.length._0_8_ = local_138.length._0_8_ & 0xffffffffffff0000;
        local_138.meta = (void *)0x0;
        local_138.body = (void *)0x0;
        local_e8 = docio_read_doc_key_meta(local_158,local_150,&local_138,true);
        if ((long)local_e8 < 1) {
          uVar9 = (uint)local_e8;
          if (local_e8 == 0) {
            uVar9 = 0xfffffff7;
          }
          uVar17 = (ulong)uVar9;
          goto LAB_0012de04;
        }
        if (((local_138.length._8_8_ & 0x400000000) != 0) && ((iterator->opt & 2) != 0)) {
          free(local_138.key);
          free(local_138.meta);
          uVar17 = 0xfffffff7;
          goto LAB_0012de04;
        }
        local_d8.key = local_138.key;
        local_d8.keylen = local_138.length._0_8_ & 0xffff;
        local_d8.seqnum = 0xffffffffffffffff;
        shandle = iterator->handle->shandle;
        fVar8 = wal_find(shandle->snap_txn,iterator->handle->file,&shandle->cmp_info,shandle,
                         &local_d8,&local_e8);
        if (((fVar8 == FDB_RESULT_SUCCESS) &&
            ((void *)(iterator->field_10).start_seqnum <= local_d8.seqnum)) &&
           (local_d8.seqnum <= (void *)(iterator->field_12).end_seqnum)) {
LAB_0012dcd3:
          free(local_138.key);
          pvVar18 = local_138.meta;
LAB_0012dcdd:
          free(pvVar18);
          iVar10 = 2;
        }
        else {
          local_78.length.keylen = 0;
          local_78.length.metalen = 0;
          local_78.length.bodylen = 0;
          local_78.length.bodylen_ondisk = 0;
          local_78.length.flag = '\0';
          local_78.length.checksum = '\0';
          local_78.length.reserved = 0;
          local_78.timestamp = 0;
          local_78.meta = (void *)0x0;
          local_78.body = (void *)0x0;
          local_78.key = (void *)0x0;
          local_78.field_3.seqnum = 0;
          hVar11 = hbtrie_find(iterator->handle->trie,local_138.key,(uint)local_138.length.keylen,
                               &local_f8);
          btreeblk_end(iterator->handle->bhandle);
          if (hVar11 != HBTRIE_RESULT_SUCCESS) goto LAB_0012dcd3;
          local_78.key = local_138.key;
          local_f8 = local_f8 >> 0x38 | (local_f8 & 0xff000000000000) >> 0x28 |
                     (local_f8 & 0xff0000000000) >> 0x18 | (local_f8 & 0xff00000000) >> 8 |
                     (local_f8 & 0xff000000) << 8 | (local_f8 & 0xff0000) << 0x18 |
                     (local_f8 & 0xff00) << 0x28 | local_f8 << 0x38;
          local_78.meta = (void *)0x0;
          uVar13 = docio_read_doc_key_meta(iterator->handle->dhandle,local_f8,&local_78,true);
          if (0 < (long)uVar13) {
            if ((local_78.field_3.seqnum <= local_138.field_3.seqnum) ||
               ((iterator->field_12).end_seqnum < local_78.field_3.seqnum)) {
              free(local_78.meta);
              free(local_138.key);
              free(local_138.meta);
              iVar10 = 0;
              goto LAB_0012dce7;
            }
            free(local_138.key);
            free(local_138.meta);
            pvVar18 = local_78.meta;
            goto LAB_0012dcdd;
          }
          free(local_138.key);
          free(local_138.meta);
          uVar17 = uVar13 & 0xffffffff;
          if (uVar13 == 0) {
            uVar17 = 0xfffffff7;
          }
          iVar10 = 1;
        }
LAB_0012dce7:
        bVar21 = true;
      } while (iVar10 == 2);
      if (iVar10 == 0) {
LAB_0012e0d1:
        iterator->_dhandle = local_158;
        iterator->_get_offset = local_150;
        fVar8 = FDB_RESULT_SUCCESS;
        break;
      }
LAB_0012de04:
      fVar8 = (fdb_status)uVar17;
    } while (fVar8 == FDB_RESULT_KEY_NOT_FOUND);
LAB_0012e103:
    if (fVar8 != FDB_RESULT_SUCCESS) {
LAB_0012e107:
      iterator->_dhandle = (docio_handle *)0x0;
      if ((iterator->direction != '\0') &&
         (((iterator->seqtree_iterator != (btree_iterator *)0x0 ||
           (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0)) && (iterator->status == '\0'))))
      {
        iterator->_offset = 0xffffffffffffffff;
      }
      goto LAB_0012e13f;
    }
  }
  else {
    if (iterator->direction != '\x02') {
      iterator->_offset = 0xffffffffffffffff;
      if (iterator->tree_cursor == (wal_item *)0x0) {
        if (iterator->tree_cursor_prev != (wal_item *)0x0) {
          pwVar12 = wal_itr_search_smaller(iterator->wal_itr,iterator->tree_cursor_prev);
          iterator->tree_cursor = pwVar12;
          iterator->status = '\0';
        }
      }
      else {
        pwVar12 = wal_itr_search_smaller(iterator->wal_itr,iterator->tree_cursor);
        iterator->tree_cursor = pwVar12;
        if ((iterator->direction == '\x01') && (iterator->status != '\x01')) {
          pwVar12 = wal_itr_prev(iterator->wal_itr);
          iterator->tree_cursor = pwVar12;
        }
      }
    }
    value_buf = &iterator->_offset;
    local_f0 = &iterator->_keylen;
    hVar11 = HBTRIE_RESULT_SUCCESS;
LAB_0012de3f:
    do {
      keylen = local_f0;
      pvVar18 = iterator->_key;
      handle = iterator->handle->dhandle;
      if (iterator->_offset == 0xffffffffffffffff) {
        local_d8.keylen = 0;
        local_d8.metalen = 0;
        local_d8.bodylen = local_d8.bodylen & 0xffffffff00000000;
        local_d8.seqnum = 0;
        local_d8.offset = 0;
        local_d8.size_ondisk = 0;
        local_d8.key = (void *)0x0;
        do {
          do {
            hVar11 = hbtrie_prev(iterator->hbtrie_iterator,pvVar18,keylen,value_buf);
            btreeblk_end(iterator->handle->bhandle);
            uVar17 = iterator->_offset;
            uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                     (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                     (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                     (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
            iterator->_offset = uVar17;
            if (((iterator->opt & 2) == 0) || (hVar11 != HBTRIE_RESULT_SUCCESS)) goto LAB_0012de61;
            local_d8.key = (void *)0x0;
            local_d8.seqnum = 0;
            local_d8.bodylen = 0;
            local_d8.size_ondisk = 0;
            local_d8.keylen = 0;
            local_d8.metalen = 0;
            local_d8.offset = 0;
            iVar14 = docio_read_doc_key_meta(handle,uVar17,(docio_object *)&local_d8,true);
            sVar19 = local_d8.metalen;
          } while (iVar14 < 1);
          free((void *)local_d8.size_ondisk);
          free((void *)local_d8.seqnum);
        } while ((sVar19 & 0x400000000) != 0);
        hVar11 = HBTRIE_RESULT_SUCCESS;
      }
LAB_0012de61:
      if (hVar11 == HBTRIE_RESULT_INDEX_CORRUPTED) {
        fVar8 = FDB_RESULT_FILE_CORRUPTION;
        goto LAB_0012e107;
      }
      sVar19 = *keylen;
      local_140 = *value_buf;
      if ((hVar11 != HBTRIE_RESULT_SUCCESS) && (iterator->tree_cursor == (wal_item *)0x0))
      goto LAB_0012e0be;
      do {
        pwVar12 = iterator->tree_cursor;
        uVar20 = local_140;
        if (pwVar12 == (wal_item *)0x0) goto LAB_0012e03c;
        if (iterator->status == '\x01') {
          iterator->tree_cursor_prev = pwVar12;
          pwVar12 = wal_itr_prev(iterator->wal_itr);
          iterator->tree_cursor = pwVar12;
          if (pwVar12 == (wal_item *)0x0) {
            uVar20 = local_140;
            if (hVar11 == HBTRIE_RESULT_SUCCESS) goto LAB_0012e03c;
            goto LAB_0012e0be;
          }
        }
        iVar10 = 1;
        if ((hVar11 == HBTRIE_RESULT_SUCCESS) &&
           (iVar10 = _fdb_key_cmp(iterator,pwVar12->header->key,(ulong)pwVar12->header->keylen,
                                  pvVar18,sVar19), uVar20 = local_140, iVar10 < 0))
        goto LAB_0012e03c;
        wVar3 = pwVar12->action;
        if (wVar3 == '\x01') {
          bVar15 = ((byte)iterator->opt & 2) >> 1;
        }
        else {
          bVar15 = 0;
        }
        iterator->status = '\x01';
        if (iVar10 == 0) {
          *value_buf = 0xffffffffffffffff;
          if (wVar3 == '\x02' || bVar15 != 0) goto LAB_0012de3f;
          break;
        }
      } while (wVar3 == '\x02' || bVar15 != 0);
      pvVar18 = pwVar12->header->key;
      sVar19 = (size_t)pwVar12->header->keylen;
      uVar20 = pwVar12->offset;
LAB_0012e03c:
      if (uVar20 == *value_buf) {
        iterator->_offset = 0xffffffffffffffff;
        iterator->status = '\0';
      }
      if (iterator->start_key != (void *)0x0) {
        iVar10 = _fdb_key_cmp(iterator,iterator->start_key,(iterator->field_10).start_keylen,pvVar18
                              ,sVar19);
        if (iVar10 == 0) {
          if ((iterator->opt & 4) != 0) goto LAB_0012e0be;
        }
        else if (0 < iVar10) {
LAB_0012e0be:
          fVar8 = FDB_RESULT_ITERATOR_FAIL;
          goto LAB_0012e107;
        }
      }
      if (iterator->end_key == (void *)0x0) break;
      iVar10 = _fdb_key_cmp(iterator,iterator->end_key,(iterator->field_12).end_keylen,pvVar18,
                            sVar19);
      if (iVar10 != 0) {
        if (-1 < iVar10) break;
        goto LAB_0012de3f;
      }
    } while ((iterator->opt & 8) != 0);
    iterator->_dhandle = handle;
    iterator->_get_offset = uVar20;
  }
  iterator->direction = '\x02';
  fVar8 = FDB_RESULT_SUCCESS;
LAB_0012e13f:
  paVar2 = &iterator->handle->handle_busy;
  LOCK();
  if ((paVar2->super___atomic_base<unsigned_char>)._M_i == '\x01') {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\0';
  }
  UNLOCK();
  LOCK();
  paVar1 = &iterator->handle->op_stats->num_iterator_moves;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return fVar8;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_prev(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status result = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (!atomic_cas_uint8_t(&iterator->handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (iterator->hbtrie_iterator) {
        while ((result = _fdb_iterator_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    } else {
        while ((result = _fdb_iterator_seq_prev(iterator)) ==
                FDB_RESULT_KEY_NOT_FOUND);
    }
    if (result == FDB_RESULT_SUCCESS) {
        iterator->direction = FDB_ITR_REVERSE;
    } else {
        iterator->_dhandle = NULL; // fail fdb_iterator_get also
        if (iterator->direction != FDB_ITR_DIR_NONE) {
            if ((iterator->seqtree_iterator || iterator->seqtrie_iterator) &&
                    iterator->status == FDB_ITR_IDX) {
                iterator->_offset = BLK_NOT_FOUND;
            }
        }
    }

    atomic_cas_uint8_t(&iterator->handle->handle_busy, 1, 0);
    atomic_incr_uint64_t(&iterator->handle->op_stats->num_iterator_moves,
                         std::memory_order_relaxed);
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_PREV);
    return result;
}